

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O1

REF_STATUS ref_sort_same(REF_INT n,REF_INT *list0,REF_INT *list1,REF_BOOL *same)

{
  REF_STATUS RVar1;
  ulong in_RAX;
  REF_INT *unique;
  REF_INT *unique_00;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  REF_INT n0;
  REF_INT n1;
  undefined8 local_38;
  
  *same = 0;
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",0xee,
           "ref_sort_same","malloc unique0 of REF_INT negative");
    RVar1 = 1;
  }
  else {
    local_38 = in_RAX;
    unique = (REF_INT *)malloc((ulong)(uint)n << 2);
    if (unique == (REF_INT *)0x0) {
      pcVar4 = "malloc unique0 of REF_INT NULL";
      uVar3 = 0xee;
    }
    else {
      unique_00 = (REF_INT *)malloc((ulong)(uint)n << 2);
      if (unique_00 != (REF_INT *)0x0) {
        ref_sort_unique_int(n,list0,(REF_INT *)&local_38,unique);
        ref_sort_unique_int(n,list1,(REF_INT *)((long)&local_38 + 4),unique_00);
        if (((int)local_38 == local_38._4_4_) && (*same = 1, 0 < (int)local_38)) {
          uVar2 = 0;
          do {
            if (unique[uVar2] != unique_00[uVar2]) {
              *same = 0;
              break;
            }
            uVar2 = uVar2 + 1;
          } while ((local_38 & 0xffffffff) != uVar2);
        }
        free(unique_00);
        free(unique);
        return 0;
      }
      pcVar4 = "malloc unique1 of REF_INT NULL";
      uVar3 = 0xef;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",uVar3,
           "ref_sort_same",pcVar4);
    RVar1 = 2;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_sort_same(REF_INT n, REF_INT *list0, REF_INT *list1,
                                 REF_BOOL *same) {
  REF_INT n0, *unique0;
  REF_INT n1, *unique1;
  REF_INT i;
  *same = REF_FALSE;
  ref_malloc(unique0, n, REF_INT);
  ref_malloc(unique1, n, REF_INT);
  RSS(ref_sort_unique_int(n, list0, &n0, unique0), "uniq0");
  RSS(ref_sort_unique_int(n, list1, &n1, unique1), "uniq1");
  if (n0 == n1) {
    *same = REF_TRUE;
    for (i = 0; i < n0; i++) {
      if (unique0[i] != unique1[i]) {
        *same = REF_FALSE;
        break;
      }
    }
  }
  ref_free(unique1);
  ref_free(unique0);
  return REF_SUCCESS;
}